

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  iterator iVar3;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar4;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  ostringstream ostr;
  int local_218;
  allocator local_211;
  cmGraphVizWriter *local_210;
  key_type local_208;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
  *local_1e8;
  pointer local_1e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d8;
  _Base_ptr local_1d0;
  key_type local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pvVar5 = this->LocalGenerators;
  local_1e0 = (pvVar5->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_218 = cnt;
  if (local_1e0 !=
      (pvVar5->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1e8 = &this->TargetPtrs;
    local_1d0 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1d8 = &this->TargetNamesNodes;
    local_210 = this;
    do {
      p_Var7 = ((*local_1e0)->Makefile->Targets)._M_h._M_before_begin._M_nxt;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        do {
          std::__cxx11::string::string
                    ((string *)local_1a8,(char *)p_Var7[1]._M_nxt,(allocator *)&local_208);
          bVar2 = IgnoreThisTarget(this,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if (!bVar2) {
            for (p_Var6 = p_Var7[0x5c]._M_nxt; p_Var6 != p_Var7[0x5d]._M_nxt; p_Var6 = p_Var6 + 5) {
              p_Var1 = p_Var6->_M_nxt;
              std::__cxx11::string::string
                        ((string *)local_1a8,(char *)p_Var1,(allocator *)&local_208);
              bVar2 = IgnoreThisTarget(local_210,local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p,
                                local_1a8[0].field_2._M_allocated_capacity + 1);
              }
              if (!bVar2) {
                std::__cxx11::string::string
                          ((string *)local_1a8,(char *)p_Var1,(allocator *)&local_208);
                iVar3 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
                        ::find(&local_1e8->_M_t,local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                  operator_delete(local_1a8[0]._M_dataplus._M_p,
                                  local_1a8[0].field_2._M_allocated_capacity + 1);
                }
                if (iVar3._M_node == local_1d0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,
                                       (local_210->GraphNodePrefix)._M_dataplus._M_p,
                                       (local_210->GraphNodePrefix)._M_string_length);
                  std::ostream::operator<<(this_00,local_218);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::string::string((string *)&local_1c8,(char *)p_Var1,&local_211);
                  this_01 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](local_1d8,&local_1c8);
                  std::__cxx11::string::operator=((string *)this_01,(string *)&local_208);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != &local_208.field_2) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::string::string
                            ((string *)&local_208,(char *)p_Var1,(allocator *)&local_1c8);
                  ppcVar4 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
                            ::operator[](local_1e8,&local_208);
                  *ppcVar4 = (mapped_type)0x0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != &local_208.field_2) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  local_218 = local_218 + 1;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                }
              }
            }
          }
          p_Var7 = p_Var7->_M_nxt;
          this = local_210;
        } while (p_Var7 != (_Hash_node_base *)0x0);
        pvVar5 = local_210->LocalGenerators;
      }
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 !=
             (pvVar5->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return local_218;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
                                                 this->LocalGenerators.begin();
       lit != this->LocalGenerators.end();
       ++ lit )
    {
    const cmTargets* targets = &((*lit)->GetMakefile()->GetTargets());
    for ( cmTargets::const_iterator tit = targets->begin();
          tit != targets->end();
          ++ tit )
      {
      const char* realTargetName = tit->first.c_str();
      if (this->IgnoreThisTarget(realTargetName))
        {
        // Skip ignored targets
        continue;
        }
      const cmTarget::LinkLibraryVectorType* ll =
                                     &(tit->second.GetOriginalLinkLibraries());
      for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
           llit != ll->end();
           ++ llit )
        {
        const char* libName = llit->first.c_str();
        if (this->IgnoreThisTarget(libName))
          {
          // Skip ignored targets
          continue;
          }

        std::map<std::string, const cmTarget*>::const_iterator tarIt =
                                                this->TargetPtrs.find(libName);
        if ( tarIt == this->TargetPtrs.end() )
          {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = NULL;
          // str << "    \"" << ostr.c_str() << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
          }
        }
      }
    }
   return cnt;
}